

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deorbitalized.hpp
# Opt level: O2

void ExchCXX::
     kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinR2SCAN_X,_ExchCXX::BuiltinPC07OPT_K>_>::
     eval_exc_vxc_polar(double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
                       double lapl_a,double lapl_b,double tau_a,double tau_b,double *eps,
                       double *vrho_a,double *vrho_b,double *vsigma_aa,double *vsigma_ab,
                       double *vsigma_bb,double *vlapl_a,double *vlapl_b,double *vtau_a,
                       double *vtau_b)

{
  double vlapl_b_k;
  double vlapl_a_k;
  double vsigma_bb_k;
  double vsigma_aa_k;
  double vrho_b_k;
  double vrho_a_k;
  double TAU_A;
  double dummy;
  double TAU_B;
  
  mgga_screening_interface<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_polar
            (rho_a,0.0,sigma_aa,0.0,0.0,lapl_a,0.0,0.0,0.0,&TAU_A,&vrho_a_k,&dummy,&vsigma_aa_k,
             &dummy,&dummy,&vlapl_a_k,&dummy,&dummy,&dummy);
  mgga_screening_interface<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_polar
            (rho_b,0.0,sigma_bb,0.0,0.0,lapl_b,0.0,0.0,0.0,&TAU_B,&vrho_b_k,&dummy,&vsigma_bb_k,
             &dummy,&dummy,&vlapl_b_k,&dummy,&dummy,&dummy);
  TAU_A = TAU_A * rho_a;
  TAU_B = TAU_B * rho_b;
  mgga_screening_interface<ExchCXX::BuiltinR2SCAN_X>::eval_exc_vxc_polar
            (rho_a,rho_b,sigma_aa,sigma_ab,sigma_bb,lapl_a,lapl_b,TAU_A,TAU_B,eps,vrho_a,vrho_b,
             vsigma_aa,vsigma_ab,vsigma_bb,vlapl_a,vlapl_b,vtau_a,vtau_b);
  *vrho_a = *vtau_a * vrho_a_k + *vrho_a;
  *vrho_b = *vtau_b * vrho_b_k + *vrho_b;
  *vsigma_aa = *vtau_a * vsigma_aa_k + *vsigma_aa;
  *vsigma_bb = *vtau_b * vsigma_bb_k + *vsigma_bb;
  *vlapl_a = *vtau_a * vlapl_a_k;
  *vlapl_b = *vtau_b * vlapl_b_k;
  *vtau_a = 0.0;
  *vtau_b = 0.0;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double lapl_a, double lapl_b, double tau_a, double tau_b, double& eps, double& vrho_a, double& vrho_b, double& vsigma_aa, double& vsigma_ab, double& vsigma_bb, double& vlapl_a, double& vlapl_b, double& vtau_a, double& vtau_b ) {

    double TAU_A, TAU_B, vrho_a_k, vrho_b_k, vsigma_aa_k, vsigma_bb_k, vlapl_a_k, vlapl_b_k, vtau_k, dummy;
    ke_traits::eval_exc_vxc_polar(rho_a, 0.0, sigma_aa, 0.0, 0.0, lapl_a, 0.0, 0.0, 0.0, TAU_A, vrho_a_k, dummy, vsigma_aa_k, dummy, dummy, vlapl_a_k, dummy, dummy, dummy);
    ke_traits::eval_exc_vxc_polar(rho_b, 0.0, sigma_bb, 0.0, 0.0, lapl_b, 0.0, 0.0, 0.0, TAU_B, vrho_b_k, dummy, vsigma_bb_k, dummy, dummy, vlapl_b_k, dummy, dummy, dummy);

    TAU_A *= rho_a;
    TAU_B *= rho_b;

    xc_traits::eval_exc_vxc_polar(rho_a, rho_b, sigma_aa, sigma_ab, sigma_bb, lapl_a, lapl_b, TAU_A, TAU_B, eps, vrho_a, vrho_b, vsigma_aa, vsigma_ab, vsigma_bb, vlapl_a, vlapl_b, vtau_a, vtau_b);

    vrho_a    += vtau_a * vrho_a_k;
    vrho_b    += vtau_b * vrho_b_k;
    vsigma_aa += vtau_a * vsigma_aa_k;
    //vsigma_ab += .....;
    vsigma_bb += vtau_b * vsigma_bb_k;
    vlapl_a    = vtau_a * vlapl_a_k;
    vlapl_b    = vtau_b * vlapl_b_k;
    vtau_a     = 0.0;
    vtau_b     = 0.0;
  }